

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::Entity_Damage_Status_PDU
          (Entity_Damage_Status_PDU *this,EntityIdentifier *DamagedEntityID)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Entity_Damage_Status_PDU_00223478;
  (this->m_DmgEnt).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c08;
  KVar1 = (DamagedEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_DmgEnt).super_SimulationIdentifier.m_ui16SiteID =
       (DamagedEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_DmgEnt).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_DmgEnt).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220b10;
  *(undefined2 *)&(this->m_DmgEnt).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(DamagedEntityID->super_SimulationIdentifier).field_0xc;
  this->m_ui16NumDmgDescRecs = 0;
  (this->m_vDdRec).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vDdRec).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vDdRec).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '7';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x18;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

Entity_Damage_Status_PDU::Entity_Damage_Status_PDU( const EntityIdentifier & DamagedEntityID ) :
    m_DmgEnt( DamagedEntityID ),
    m_ui16NumDmgDescRecs( 0 )
{
    m_ui8PDUType = Acknowledge_R_PDU_Type;
    m_ui16PDULength = ENTITY_DAMAGE_STATE_PDU;
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_2012;
}